

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.cpp
# Opt level: O0

Value * ODDLParser::ValueAllocator::allocPrimData(ValueType type,size_t len)

{
  uchar *puVar1;
  Value *data;
  size_t len_local;
  Value *pVStack_10;
  ValueType type_local;
  
  if ((type == ddl_none) || (type == ddl_types_max)) {
    pVStack_10 = (Value *)0x0;
  }
  else {
    pVStack_10 = (Value *)operator_new(0x20);
    Value::Value(pVStack_10,type);
    switch(type) {
    case ddl_bool:
      pVStack_10->m_size = 1;
      break;
    case ddl_int8:
      pVStack_10->m_size = 1;
      break;
    case ddl_int16:
      pVStack_10->m_size = 2;
      break;
    case ddl_int32:
      pVStack_10->m_size = 4;
      break;
    case ddl_int64:
      pVStack_10->m_size = 8;
      break;
    case ddl_unsigned_int8:
      pVStack_10->m_size = 1;
      break;
    case ddl_unsigned_int16:
      pVStack_10->m_size = 2;
      break;
    case ddl_unsigned_int32:
      pVStack_10->m_size = 4;
      break;
    case ddl_unsigned_int64:
      pVStack_10->m_size = 8;
      break;
    case ddl_half:
      pVStack_10->m_size = 2;
      break;
    case ddl_float:
      pVStack_10->m_size = 4;
      break;
    case ddl_double:
      pVStack_10->m_size = 8;
      break;
    case ddl_string:
      pVStack_10->m_size = len + 1;
      break;
    case ddl_ref:
      pVStack_10->m_size = 0;
      break;
    case ddl_none:
    }
    if (pVStack_10->m_size != 0) {
      puVar1 = (uchar *)operator_new__(pVStack_10->m_size);
      pVStack_10->m_data = puVar1;
      memset(pVStack_10->m_data,0,pVStack_10->m_size);
    }
  }
  return pVStack_10;
}

Assistant:

Value *ValueAllocator::allocPrimData( Value::ValueType type, size_t len ) {
    if( type == Value::ddl_none || Value::ddl_types_max == type ) {
        return ddl_nullptr;
    }

    Value *data = new Value( type );
    switch( type ) {
        case Value::ddl_bool:
            data->m_size = sizeof( bool );
            break;
        case Value::ddl_int8:
            data->m_size = sizeof( int8 );
            break;
        case Value::ddl_int16:
            data->m_size = sizeof( int16 );
            break;
        case Value::ddl_int32:
            data->m_size = sizeof( int32 );
            break;
        case Value::ddl_int64:
            data->m_size = sizeof( int64 );
            break;
        case Value::ddl_unsigned_int8:
            data->m_size = sizeof( uint8 );
            break;
        case Value::ddl_unsigned_int16:
            data->m_size = sizeof( uint16 );
            break;
        case Value::ddl_unsigned_int32:
            data->m_size = sizeof( uint32 );
            break;
        case Value::ddl_unsigned_int64:
            data->m_size = sizeof( uint64 );
            break;
        case Value::ddl_half:
            data->m_size = sizeof( short );
            break;
        case Value::ddl_float:
            data->m_size = sizeof( float );
            break;
        case Value::ddl_double:
            data->m_size = sizeof( double );
            break;
        case Value::ddl_string:
            data->m_size = sizeof( char )*(len+1);
            break;
        case Value::ddl_ref:
            data->m_size = 0;
            break;
        case Value::ddl_none:
        case Value::ddl_types_max:
        default:
            break;
    }

    if( data->m_size ) {
        data->m_data = new unsigned char[ data->m_size ];
        ::memset(data->m_data,0,data->m_size);
    }

    return data;
}